

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::TriangleMeshNode::TriangleMeshNode
          (TriangleMeshNode *this,Ref<embree::SceneGraph::TriangleMeshNode> *imesh,
          Transformations *spaces)

{
  long *plVar1;
  long *in_RSI;
  undefined8 *in_RDI;
  Transformations *in_stack_00000160;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_00000168;
  Transformations *in_stack_000001a0;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_000001a8;
  bool in_stack_ffffffffffffff1f;
  Node *in_stack_ffffffffffffff20;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *__x;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_00;
  
  Node::Node(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1f);
  *in_RDI = &PTR__TriangleMeshNode_00648388;
  in_RDI[0xd] = *(undefined8 *)(*in_RSI + 0x68);
  __x = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
         *)(in_RDI + 0xe);
  this_00 = (vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             *)*in_RSI;
  transformMSMBlurVec3faBuffer(in_stack_00000168,in_stack_00000160);
  transformMSMBlurNormalBuffer<embree::Vec3fa>(in_stack_000001a8,in_stack_000001a0);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::vector
            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)this_00,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)__x);
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::vector(this_00,__x);
  plVar1 = in_RDI + 0x1a;
  *plVar1 = *(long *)(*in_RSI + 0xd0);
  if (*plVar1 != 0) {
    (**(code **)(*(long *)*plVar1 + 0x10))();
  }
  return;
}

Assistant:

TriangleMeshNode (Ref<SceneGraph::TriangleMeshNode> imesh, const Transformations& spaces)
        : Node(true),
          time_range(imesh->time_range),
          positions(transformMSMBlurVec3faBuffer(imesh->positions,spaces)),
          normals(transformMSMBlurNormalBuffer(imesh->normals,spaces)),
          texcoords(imesh->texcoords), triangles(imesh->triangles), material(imesh->material) {}